

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O1

BIO * BIO_new_socket(int sock,int close_flag)

{
  BIO *bio;
  
  bio = BIO_new((BIO_METHOD *)&methods_sockp);
  if (bio == (BIO *)0x0) {
    bio = (BIO *)0x0;
  }
  else {
    BIO_set_fd((BIO *)bio,sock,close_flag);
  }
  return bio;
}

Assistant:

BIO *BIO_new_socket(int fd, int close_flag) {
  BIO *ret;

  ret = BIO_new(BIO_s_socket());
  if (ret == NULL) {
    return NULL;
  }
  BIO_set_fd(ret, fd, close_flag);
  return ret;
}